

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<false,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  ParseContext *field;
  MessageLite *msg_00;
  ushort *p_00;
  char *pcVar9;
  Nonnull<const_char_*> pcVar10;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  ulong uVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar12;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ushort uVar13;
  char *p;
  ParseContext *ptr_00;
  ParseContext *pPVar14;
  uint *puVar15;
  ParseContext *pPVar16;
  pair<const_char_*,_unsigned_int> pVar17;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_70;
  int local_4c;
  int local_40;
  
  puVar15 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar15 & 3) != 0) {
    AlignFail(puVar15);
  }
  uVar3 = *(ushort *)((long)puVar15 + 10);
  if ((ulong)(uVar3 & 0x30) == 0x20) {
    pcVar10 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        ((ulong)(uVar3 & 0x30),0x20,
                         "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                        );
  }
  if (pcVar10 == (Nonnull<const_char_*>)0x0) {
    if ((uVar3 & 0x1c0) == 0) {
      pcVar10 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar3 & 0x1c0,0,
                           "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepMessage)"
                          );
    }
    if (pcVar10 == (Nonnull<const_char_*>)0x0) {
      if ((data.field_0._0_4_ & 7) != 2) {
        UNRECOVERED_JUMPTABLE = table->fallback;
LAB_00fc9557:
        pcVar9 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar9;
      }
      field = (ParseContext *)((long)&msg->_vptr_MessageLite + (ulong)*puVar15);
      if (((ulong)field & 7) != 0) {
        AlignFail(field);
      }
      local_70 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  ((long)&table->has_bits_offset +
                  (ulong)(ushort)puVar15[2] * 8 + (ulong)table->aux_offset);
      uVar13 = uVar3 >> 9 & 3;
      pPVar16 = (ParseContext *)hasbits;
      if (uVar13 != 2) {
        if ((uVar3 >> 9 & 3) == 0) {
          MpRepeatedMessageOrGroup<false,false>((TcParser *)&stack0xffffffffffffffc0);
          goto LAB_00fc9677;
        }
        if (uVar13 != 1) {
          local_70.data = *local_70.data;
        }
        local_70.data = (uint64_t)MessageLite::GetTcParseTable(local_70.data);
      }
      do {
        ptr_00 = field;
        msg_00 = AddMessage((TcParseTableBase *)local_70,(RepeatedPtrFieldBase *)field);
        pVar17._8_8_ = extraout_RDX;
        pVar17.first = (char *)msg_00;
        bVar1 = (byte)*(ushort *)ptr;
        aVar12.data._1_7_ = 0;
        aVar12.data._0_1_ = bVar1;
        if ((char)bVar1 < '\0') {
          ptr_00 = (ParseContext *)(ulong)(uint)bVar1;
          pVar17 = (pair<const_char_*,_unsigned_int>)ReadSizeFallback(ptr,(uint)bVar1);
          pPVar14 = (ParseContext *)pVar17.first;
          aVar12.data = pVar17._8_8_ & 0xffffffff;
        }
        else {
          pPVar14 = (ParseContext *)((long)ptr + 1);
        }
        if ((pPVar14 == (ParseContext *)0x0) || (ctx->depth_ < 1)) {
          pPVar14 = (ParseContext *)0x0;
        }
        else {
          ptr_00 = ctx;
          EpsCopyInputStream::PushLimit
                    ((EpsCopyInputStream *)&stack0xffffffffffffffc0,(char *)ctx,(int)pPVar14);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = extraout_RDX_00;
          pVar17 = (pair<const_char_*,_unsigned_int>)(auVar4 << 0x40);
          local_4c = local_40;
          ctx->depth_ = ctx->depth_ + -1;
        }
        if (pPVar14 == (ParseContext *)0x0) {
LAB_00fc94c0:
          p_00 = (ushort *)0x0;
        }
        else {
          iVar8 = ctx->depth_;
          aVar12 = local_70;
          p_00 = (ushort *)
                 ParseLoopPreserveNone(msg_00,(char *)pPVar14,ctx,(TcParseTableBase *)local_70);
          uVar11 = extraout_RDX_01;
          if (p_00 != (ushort *)0x0) {
            pPVar14 = (ParseContext *)(long)ctx->depth_;
            if (iVar8 == ctx->depth_) {
              pcVar10 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  ((long)iVar8,(long)pPVar14,"old_depth == depth_");
              uVar11 = extraout_RDX_02;
            }
            if (pcVar10 != (Nonnull<const_char_*>)0x0) {
              MpRepeatedMessageOrGroup<false,false>();
              goto LAB_00fc9689;
            }
          }
          ctx->depth_ = ctx->depth_ + 1;
          uVar7 = (ctx->super_EpsCopyInputStream).limit_ + local_4c;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar11;
          pVar17 = (pair<const_char_*,_unsigned_int>)(auVar5 << 0x40);
          (ctx->super_EpsCopyInputStream).limit_ = uVar7;
          ptr_00 = pPVar14;
          if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_00fc94c0;
          aVar12._0_4_ = (int)uVar7 >> 0x1f & uVar7;
          aVar12.data._4_4_ = 0;
          pcVar9 = (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar12._0_4_;
          pVar17._8_8_ = uVar11;
          pVar17.first = pcVar9;
          (ctx->super_EpsCopyInputStream).limit_end_ = pcVar9;
        }
        pPVar14 = pVar17._8_8_;
        if (p_00 == (ushort *)0x0) {
          iVar8 = 8;
        }
        else if (p_00 < (ctx->super_EpsCopyInputStream).limit_end_) {
          bVar1 = (byte)*p_00;
          ptr = (char *)((long)p_00 + 1);
          pPVar16 = (ParseContext *)(ulong)bVar1;
          if ((char)bVar1 < '\0') {
            bVar2 = *ptr;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = pPVar14;
            pVar17 = (pair<const_char_*,_unsigned_int>)(auVar6 << 0x40);
            aVar12.data = (ulong)bVar2 << 7;
            uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            pPVar14 = (ParseContext *)(ulong)uVar7;
            if ((char)bVar2 < '\0') {
              pVar17 = ReadTagFallback((char *)p_00,uVar7);
              ptr = pVar17.first;
              pPVar16 = (ParseContext *)(ulong)pVar17.second;
              ptr_00 = pPVar14;
            }
            else {
              ptr = (char *)(p_00 + 1);
              pPVar16 = pPVar14;
            }
          }
          pPVar14 = pVar17._8_8_;
          iVar8 = (uint)((ushort *)ptr == (ushort *)0x0) << 3;
        }
        else {
          iVar8 = 9;
        }
        if (iVar8 != 0) {
          if (iVar8 == 8) {
            pcVar9 = Error(msg,(char *)ptr_00,pPVar14,(TcFieldData)aVar12,table,hasbits);
            return pcVar9;
          }
          goto LAB_00fc95ca;
        }
      } while ((uint)pPVar16 == data.field_0._0_4_);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p_00) {
LAB_00fc95ca:
        if ((ulong)table->has_bits_offset != 0) {
          puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar15 & 3) != 0) {
LAB_00fc9677:
            AlignFail();
          }
          *puVar15 = *puVar15 | (uint)hasbits;
        }
        return (char *)p_00;
      }
      uVar7 = (uint)table->fast_idx_mask & (uint)*p_00;
      if ((uVar7 & 7) == 0) {
        uVar11 = (ulong)(uVar7 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*p_00 ^ *(ulong *)(&table[1].fast_idx_mask + uVar11 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar11);
        ptr = (char *)p_00;
        goto LAB_00fc9557;
      }
      goto LAB_00fc96a3;
    }
  }
  else {
LAB_00fc9689:
    MpRepeatedMessageOrGroup<false,false>();
  }
  MpRepeatedMessageOrGroup<false,false>();
LAB_00fc96a3:
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}